

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjLeft(Cba_Ntk_t *p,int i)

{
  int iVar1;
  
  iVar1 = Cba_ObjFon0(p,i);
  iVar1 = Cba_FonRange(p,iVar1);
  iVar1 = Cba_NtkRangeLeft(p,iVar1);
  return iVar1;
}

Assistant:

static inline int            Cba_ObjLeft( Cba_Ntk_t * p, int i )             { return Cba_FonLeft( p, Cba_ObjFon0(p, i) );                                                 }